

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O1

Storage __thiscall
de::Random::chooseWeighted<rsg::Variable::Storage,rsg::Variable::Storage_const*,float*>
          (Random *this,Storage *first,Storage *last,float *weight)

{
  int iVar1;
  ulong extraout_RAX;
  ulong uVar2;
  long lVar3;
  Storage *pSVar4;
  Storage *pSVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = 0.0;
  if (first != last) {
    iVar1 = 1;
    lVar3 = 0;
    do {
      fVar6 = fVar6 + weight[lVar3];
      lVar3 = (long)iVar1;
      iVar1 = iVar1 + 1;
    } while (first + lVar3 != last);
  }
  fVar7 = deRandom_getFloat(&this->m_rnd);
  pSVar4 = last;
  if (first != last) {
    fVar7 = fVar6 * fVar7 + 0.0;
    iVar1 = 1;
    lVar3 = 0;
    fVar6 = 0.0;
    uVar2 = extraout_RAX;
    pSVar5 = first;
    do {
      fVar6 = fVar6 + weight[lVar3];
      if (fVar7 < fVar6) {
        uVar2 = (ulong)*pSVar5;
      }
      else if (0.0 < weight[lVar3]) {
        pSVar4 = pSVar5;
      }
      if (fVar7 < fVar6) {
        return (Storage)uVar2;
      }
      lVar3 = (long)iVar1;
      pSVar5 = first + lVar3;
      iVar1 = iVar1 + 1;
    } while (pSVar5 != last);
  }
  return *pSVar4;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}